

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O0

size_t mi_usable_size(void *p)

{
  size_t sVar1;
  char *in_stack_00000010;
  void *in_stack_00000018;
  
  sVar1 = _mi_usable_size(in_stack_00000018,in_stack_00000010);
  return sVar1;
}

Assistant:

static inline size_t _mi_usable_size(const void* p, const char* msg) mi_attr_noexcept {
  const mi_segment_t* const segment = mi_checked_ptr_segment(p, msg);
  if mi_unlikely(segment==NULL) return 0;
  const mi_page_t* const page = _mi_segment_page_of(segment, p);
  if mi_likely(!mi_page_has_aligned(page)) {
    const mi_block_t* block = (const mi_block_t*)p;
    return mi_page_usable_size_of(page, block);
  }